

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O2

QDataStream * __thiscall QDataStream::operator<<(QDataStream *this,qint16 i)

{
  ssize_t sVar1;
  size_t in_RCX;
  long in_FS_OFFSET;
  qint16 i_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  i_local = i;
  if ((this->dev != (QIODevice *)0x0) && (this->q_status == '\0')) {
    if (this->noswap == false) {
      i_local = i << 8 | (ushort)i >> 8;
    }
    sVar1 = QIODevice::write(this->dev,(int)&i_local,(void *)0x2,in_RCX);
    if (sVar1 != 2) {
      this->q_status = '\x03';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &QDataStream::operator<<(qint16 i)
{
    CHECK_STREAM_WRITE_PRECOND(*this)
    if (!noswap) {
        i = qbswap(i);
    }
    if (dev->write((char *)&i, sizeof(qint16)) != sizeof(qint16))
        q_status = WriteFailed;
    return *this;
}